

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O1

bool __thiscall
cmBinUtilsMacOSMachOLinker::ResolveRPathDependency
          (cmBinUtilsMacOSMachOLinker *this,string *name,string *executablePath,string *loaderPath,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rpaths,string *path,bool *resolved)

{
  cmBinUtilsMacOSMachOLinker *pcVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  cmBinUtilsMacOSMachOLinker *this_00;
  cmBinUtilsMacOSMachOLinker *this_01;
  pointer pbVar5;
  bool bVar6;
  string searchFile;
  undefined1 local_68 [32];
  string *local_48;
  string *local_40;
  pointer local_38;
  
  pbVar5 = (rpaths->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (rpaths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  bVar6 = pbVar5 == local_38;
  if (!bVar6) {
    pcVar1 = (cmBinUtilsMacOSMachOLinker *)(local_68 + 0x10);
    local_48 = executablePath;
    local_40 = loaderPath;
    do {
      pcVar2 = (name->_M_dataplus)._M_p;
      local_68._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_68,pcVar2,pcVar2 + name->_M_string_length);
      std::__cxx11::string::replace((ulong)local_68,0,(char *)0x6,(ulong)(pbVar5->_M_dataplus)._M_p)
      ;
      this_01 = (cmBinUtilsMacOSMachOLinker *)local_68._0_8_;
      this_00 = (cmBinUtilsMacOSMachOLinker *)local_68._0_8_;
      iVar4 = strncmp((char *)local_68._0_8_,"@loader_path/",0xd);
      if (iVar4 == 0) {
        ResolveLoaderPathDependency(this_00,(string *)local_68,local_40,path,resolved);
LAB_0036b997:
        if (*resolved != false) {
LAB_0036b9e9:
          if ((cmBinUtilsMacOSMachOLinker *)local_68._0_8_ != pcVar1) {
            operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
          }
          if (!bVar6) {
            return true;
          }
          break;
        }
      }
      else {
        iVar4 = strncmp((char *)this_01,"@executable_path/",0x11);
        if (iVar4 == 0) {
          ResolveExecutablePathDependency(this_01,(string *)local_68,local_48,path,resolved);
          goto LAB_0036b997;
        }
        bVar3 = cmsys::SystemTools::PathExists((string *)local_68);
        if (bVar3) {
          std::__cxx11::string::_M_assign((string *)path);
          *resolved = true;
          goto LAB_0036b9e9;
        }
      }
      if ((cmBinUtilsMacOSMachOLinker *)local_68._0_8_ != pcVar1) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      pbVar5 = pbVar5 + 1;
      bVar6 = pbVar5 == local_38;
    } while (!bVar6);
  }
  *resolved = false;
  return true;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ResolveRPathDependency(
  std::string const& name, std::string const& executablePath,
  std::string const& loaderPath, std::vector<std::string> const& rpaths,
  std::string& path, bool& resolved)
{
  for (std::string const& rpath : rpaths) {
    std::string searchFile = name;
    searchFile.replace(0, 6, rpath);
    if (cmHasLiteralPrefix(searchFile, "@loader_path/")) {
      if (!this->ResolveLoaderPathDependency(searchFile, loaderPath, path,
                                             resolved)) {
        return false;
      }
      if (resolved) {
        return true;
      }
    } else if (cmHasLiteralPrefix(searchFile, "@executable_path/")) {
      if (!this->ResolveExecutablePathDependency(searchFile, executablePath,
                                                 path, resolved)) {
        return false;
      }
      if (resolved) {
        return true;
      }
    } else if (cmSystemTools::PathExists(searchFile)) {
      /*
       * paraphrasing @ben.boeckel:
       *  if /b/libB.dylib is supposed to be used,
       *  /a/libbB.dylib will be found first if it exists. CMake tries to
       *  sort rpath directories to avoid this, but sometimes there is no
       *  right answer.
       *
       *  I believe it is possible to resolve this using otools -l
       *  then checking the LC_LOAD_DYLIB command whose name is
       *  equal to the value of search_file, UNLESS the build
       *  specifically sets the RPath to paths that will match
       *  duplicate libs; at this point can we just point to
       *  user error, or is there a reason why the advantages
       *  to this scenario outweigh its disadvantages?
       *
       *  Also priority seems to be the order as passed in when compiled
       *  so as long as this method's resolution guarantees priority
       *  in that manner further checking should not be necessary?
       */
      path = searchFile;
      resolved = true;
      return true;
    }
  }

  resolved = false;
  return true;
}